

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool read_header(BinarySource *src,char *header)

{
  uchar uVar1;
  int local_24;
  int c;
  int len;
  char *header_local;
  BinarySource *src_local;
  
  local_24 = 0x27;
  _c = (uchar *)header;
  while( true ) {
    uVar1 = BinarySource_get_byte(src->binarysource_);
    if (((uVar1 == '\n') || (uVar1 == '\r')) || (src->binarysource_->err != BSE_NO_ERROR)) {
      return false;
    }
    if (uVar1 == ':') {
      uVar1 = BinarySource_get_byte(src->binarysource_);
      if (uVar1 != ' ') {
        return false;
      }
      *_c = '\0';
      return true;
    }
    if (local_24 == 0) break;
    *_c = uVar1;
    local_24 = local_24 + -1;
    _c = _c + 1;
  }
  return false;
}

Assistant:

static bool read_header(BinarySource *src, char *header)
{
    int len = 39;
    int c;

    while (1) {
        c = get_byte(src);
        if (c == '\n' || c == '\r' || get_err(src))
            return false;              /* failure */
        if (c == ':') {
            c = get_byte(src);
            if (c != ' ')
                return false;
            *header = '\0';
            return true;               /* success! */
        }
        if (len == 0)
            return false;              /* failure */
        *header++ = c;
        len--;
    }
    return false;                      /* failure */
}